

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O1

pair<int,_double>
jsoncons::decode_traits<std::pair<int,double>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  basic_staj_event<char> *pbVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double dVar3;
  pair<int,_double> pVar4;
  undefined1 local_29;
  double local_28;
  
  (*cursor->_vptr_basic_staj_cursor[2])(cursor,ec);
  dVar3 = 0.0;
  uVar2 = 0;
  if (ec->_M_value != 0) goto LAB_001a60b5;
  iVar1 = (*cursor->_vptr_basic_staj_cursor[4])(cursor);
  if (*(char *)CONCAT44(extraout_var,iVar1) == '\x0e') {
    (*cursor->_vptr_basic_staj_cursor[8])(cursor,ec);
    if (ec->_M_value == 0) {
      pbVar5._0_4_ = (basic_staj_event<char> *)(*cursor->_vptr_basic_staj_cursor[4])(cursor);
      uVar2 = basic_staj_event<char>::get_<int,std::allocator<char>>(pbVar5._0_4_,&local_29,ec);
      if ((ec->_M_value == 0) &&
         ((*cursor->_vptr_basic_staj_cursor[8])(cursor,ec), ec->_M_value == 0)) {
        iVar1 = (*cursor->_vptr_basic_staj_cursor[4])(cursor);
        local_28 = basic_staj_event<char>::as_double
                             ((basic_staj_event<char> *)CONCAT44(extraout_var_00,iVar1),ec);
        if (ec->_M_value == 0) {
          (*cursor->_vptr_basic_staj_cursor[8])(cursor,ec);
          iVar1 = (*cursor->_vptr_basic_staj_cursor[4])(cursor);
          dVar3 = local_28;
          if (*(char *)CONCAT44(extraout_var_01,iVar1) == '\x0f') goto LAB_001a60b5;
          goto LAB_001a60a7;
        }
      }
    }
  }
  else {
LAB_001a60a7:
    std::error_code::operator=(ec,not_pair);
  }
  dVar3 = 0.0;
  uVar2 = 0;
LAB_001a60b5:
  pVar4._4_4_ = 0;
  pVar4.first = uVar2;
  pVar4.second = dVar3;
  return pVar4;
}

Assistant:

static std::pair<T1, T2> decode(basic_staj_cursor<CharT>& cursor,
            json_decoder<Json, TempAllocator>& decoder,
            std::error_code& ec)
        {
            using value_type = std::pair<T1, T2>;
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            cursor.next(ec); // skip past array
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type();
            }

            T1 v1 = decode_traits<T1,CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            T2 v2 = decode_traits<T2, CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);

            if (cursor.current().event_type() != staj_event_type::end_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            return std::make_pair(v1, v2);
        }